

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall Jinx::Variant::Copy(Variant *this,Variant *copy)

{
  Variant *copy_local;
  Variant *this_local;
  
  this->m_type = copy->m_type;
  switch(this->m_type) {
  case Null:
    break;
  case Number:
    (this->field_1).m_number = (copy->field_1).m_number;
    break;
  case Integer:
    (this->field_1).m_number = (copy->field_1).m_number;
    break;
  case Boolean:
    (this->field_1).m_boolean = (bool)((copy->field_1).m_boolean & 1);
    break;
  case String:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              (&(this->field_1).m_string);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (&(this->field_1).m_string,&(copy->field_1).m_string);
    break;
  case Collection:
    std::
    shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
    ::shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                  *)&(this->field_1).m_string);
    std::
    shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
    ::operator=((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                 *)&(this->field_1).m_string,
                (shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                 *)&(copy->field_1).m_string);
    break;
  case CollectionItr:
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
    ::
    pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_true>
              ((pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
                *)&(this->field_1).m_string);
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
    ::operator=((pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
                 *)&(this->field_1).m_string,(type)&(copy->field_1).m_string);
    break;
  case Function:
    (this->field_1).m_number = (copy->field_1).m_number;
    break;
  case Coroutine:
    std::shared_ptr<Jinx::ICoroutine>::shared_ptr
              ((shared_ptr<Jinx::ICoroutine> *)&(this->field_1).m_string);
    std::shared_ptr<Jinx::ICoroutine>::operator=
              ((shared_ptr<Jinx::ICoroutine> *)&(this->field_1).m_string,
               (shared_ptr<Jinx::ICoroutine> *)&(copy->field_1).m_string);
    break;
  case UserObject:
    std::shared_ptr<Jinx::IUserObject>::shared_ptr
              ((shared_ptr<Jinx::IUserObject> *)&(this->field_1).m_string);
    std::shared_ptr<Jinx::IUserObject>::operator=
              ((shared_ptr<Jinx::IUserObject> *)&(this->field_1).m_string,
               (shared_ptr<Jinx::IUserObject> *)&(copy->field_1).m_string);
    break;
  case Buffer:
    std::shared_ptr<Jinx::Buffer>::shared_ptr((shared_ptr<Jinx::Buffer> *)&(this->field_1).m_string)
    ;
    std::shared_ptr<Jinx::Buffer>::operator=
              ((shared_ptr<Jinx::Buffer> *)&(this->field_1).m_string,
               (shared_ptr<Jinx::Buffer> *)&(copy->field_1).m_string);
    break;
  case Guid:
    (this->field_1).m_number = (copy->field_1).m_number;
    (this->field_1).m_string._M_string_length = (copy->field_1).m_string._M_string_length;
    break;
  case ValType:
    (this->field_1).m_valType = (copy->field_1).m_valType;
    break;
  default:
    __assert_fail("!\"Unknown variant type!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                  ,0x322a,"void Jinx::Variant::Copy(const Variant &)");
  }
  return;
}

Assistant:

inline void Variant::Copy(const Variant & copy)
	{
		m_type = copy.m_type;
		switch (m_type)
		{
			case ValueType::Null:
				break;
			case ValueType::Number:
				m_number = copy.m_number;
				break;
			case ValueType::Integer:
				m_integer = copy.m_integer;
				break;
			case ValueType::Boolean:
				m_boolean = copy.m_boolean;
				break;
			case ValueType::String:
				new(&m_string) String();
				m_string = copy.m_string;
				break;
			case ValueType::Collection:
				new(&m_collection) CollectionPtr();
				m_collection = copy.m_collection;
				break;
			case ValueType::CollectionItr:
				new(&m_collectionItrPair) CollectionItrPair();
				m_collectionItrPair = copy.m_collectionItrPair;
				break;
			case ValueType::Function:
				m_function = copy.m_function;
				break;
			case ValueType::Coroutine:
				new(&m_coroutine) CoroutinePtr();
				m_coroutine = copy.m_coroutine;
				break;
			case ValueType::UserObject:
				new(&m_userObject) UserObjectPtr();
				m_userObject = copy.m_userObject;
				break;
			case ValueType::Buffer:
				new(&m_buffer) BufferPtr();
				m_buffer = copy.m_buffer;
				break;
			case ValueType::Guid:
				m_guid = copy.m_guid;
				break;
			case ValueType::ValType:
				m_valType = copy.m_valType;
				break;
			default:
				assert(!"Unknown variant type!");
		};
	}